

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench-feed.c
# Opt level: O3

void bench_db_2_nonsemantic(void)

{
  bm_results_t res;
  bm_results_t local_58;
  
  local_58.iter10000 = 0;
  local_58.run10 = 0;
  local_58.run100 = 0;
  local_58.run1000 = 0;
  local_58.run10000 = 0;
  local_58.iter100 = 0;
  local_58.iter1000 = 0;
  local_58.run1 = 1;
  local_58.iter1 = bm_run_n(1,_bm_db_2);
  local_58.run10 = 1;
  local_58.iter10 = bm_run_n(10,_bm_db_2);
  bm_display_results(&local_58,"/ feed dir -> db parsing (non-semantic)");
  return;
}

Assistant:

void bench_db_2_nonsemantic(void) {
    bm_results_t res = bm_init_results();

    bm_run_1(&res, _bm_db_2);
    bm_run_10(&res, _bm_db_2);

    bm_display_results(&res, "/ feed dir -> db parsing (non-semantic)");
}